

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

TCompareResult __thiscall
Refal2::CArbitraryInteger::Compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  TCompareResult TVar3;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = IsNegative(this);
  bVar2 = IsNegative(operand);
  if (bVar1 == bVar2) {
    TVar3 = compare(this,operand);
    if (TVar3 == CR_Less) {
      bVar1 = IsNegative(this);
      if (!bVar1) {
        return CR_Less;
      }
      return CR_Great;
    }
    if (TVar3 == CR_Equal) {
      return CR_Equal;
    }
    if (TVar3 != CR_Great) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                    ,0xc6,
                    "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::Compare(const CArbitraryInteger &) const"
                   );
    }
  }
  bVar1 = IsNegative(this);
  this_local._4_4_ = CR_Great;
  if (bVar1) {
    this_local._4_4_ = CR_Less;
  }
  return this_local._4_4_;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::Compare(
	const CArbitraryInteger& operand ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		switch( compare( operand ) ) {
			case CR_Less:
				return ( IsNegative() ? CR_Great : CR_Less );
			case CR_Equal:
				return CR_Equal;
			case CR_Great:
				break;
			default:
				assert( false );
				break;
		}
	}
	return ( IsNegative() ? CR_Less : CR_Great );
}